

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O3

Union * __thiscall
FactorisedJoin::leapfroggingJoin
          (FactorisedJoin *this,DTreeNode *node,int *lower,int *upper,uint partition)

{
  DTreeNode **ppDVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  int *left;
  int *upper_00;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar7;
  pointer ppVar8;
  Database pTVar9;
  DTreeNode *node_00;
  iterator iVar10;
  iterator __position;
  long lVar11;
  bool bVar12;
  int iVar13;
  iterator iVar14;
  PartitionAttributes *pPVar15;
  Union *pUVar16;
  double *pdVar17;
  Union **ppUVar18;
  undefined8 uVar19;
  long lVar20;
  vector<node::Union*,std::allocator<node::Union*>> *pvVar21;
  long lVar22;
  int i;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  pointer pdVar26;
  ulong uVar27;
  long lVar28;
  __hashtable *__h;
  FactorisedJoin *this_00;
  pthread_mutex_t *__mutex;
  DTreeNode **ppDVar29;
  DTreeNode *node_01;
  ulong __n;
  double val;
  int rel;
  allocator_type local_e9;
  DTreeNode *local_e8;
  ulong local_e0;
  vector<double,std::allocator<double>> *local_d8;
  long local_d0;
  ulong local_c8;
  vector<node::Union*,std::allocator<node::Union*>> *local_c0;
  Union **local_b8;
  FactorisedJoin *local_b0;
  long local_a8;
  int *l;
  uint local_94;
  vector<double,_std::allocator<double>_> *local_90;
  double *local_88;
  int *local_80;
  vector<double,_std::allocator<double>_> keyVals;
  vector<double,_std::allocator<double>_> keyVals_1;
  
  local_d0 = (long)node->_id;
  bVar3 = node->_caching;
  pPVar15 = this->_partitionFields;
  uVar24 = (ulong)partition;
  __mutex = (pthread_mutex_t *)(uVar24 * 0x40);
  pdVar17 = pPVar15[uVar24].varMap;
  local_c8 = (ulong)(uint)node->_numOfChildren;
  local_e8 = node;
  local_b0 = this;
  local_94 = partition;
  if (bVar3 == true) {
    keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(double)node->_id;
    local_b8 = (Union **)lower;
    std::vector<double,_std::allocator<double>_>::vector
              (&keyVals,((long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2) + 1,
               (value_type_conflict3 *)&keyVals_1,(allocator_type *)&l);
    piVar6 = (node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = (long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar6;
    if (lVar20 != 0) {
      lVar20 = lVar20 >> 2;
      lVar25 = 0;
      do {
        keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar25] = pdVar17[piVar6[lVar25]];
        lVar25 = lVar25 + 1;
      } while (lVar20 + (ulong)(lVar20 == 0) != lVar25);
    }
    iVar13 = pthread_mutex_lock((pthread_mutex_t *)&this->_cacheMutex);
    if (iVar13 != 0) {
      iVar13 = std::__throw_system_error(iVar13);
      goto LAB_0011f67e;
    }
    iVar14 = std::
             _Hashtable<std::vector<double,_std::allocator<double>_>,_std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->_caches)._M_h,&keyVals);
    if (iVar14.
        super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      node = *(DTreeNode **)
              ((long)iVar14.
                     super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
                     ._M_cur + 0x20);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_cacheMutex);
    if (keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (iVar14.
        super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      return (Union *)node;
    }
    pPVar15 = local_b0->_partitionFields;
    lower = (int *)local_b8;
  }
  this_00 = local_b0;
  left = pPVar15[uVar24].LOWERBOUND[local_d0];
  l = left;
  local_88 = pdVar17;
  memcpy(left,lower,dfdb::params::NUM_OF_TABLES << 2);
  upper_00 = this_00->_partitionFields[uVar24].UPPERBOUND[local_d0];
  memcpy(upper_00,upper,dfdb::params::NUM_OF_TABLES << 2);
  lVar25 = local_d0;
  node_01 = local_e8;
  pPVar15 = this_00->_partitionFields;
  lVar20 = local_d0 * 3;
  local_d8 = (vector<double,std::allocator<double>> *)(pPVar15[uVar24].values + local_d0);
  if (*(long *)(local_d8 + 8) != *(long *)local_d8) {
    *(long *)(local_d8 + 8) = *(long *)local_d8;
  }
  local_90 = pPVar15[uVar24].localCount + local_d0;
  pdVar26 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar26) {
    (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar26;
  }
  local_c0 = (vector<node::Union*,std::allocator<node::Union*>> *)
             (pPVar15[uVar24].pointers + local_d0);
  if (*(long *)(local_c0 + 8) != *(long *)local_c0) {
    *(long *)(local_c0 + 8) = *(long *)local_c0;
  }
  local_b8 = pPVar15[uVar24].localPointerPlaceholder[local_d0];
  local_80 = pPVar15[uVar24].ordering[local_d0];
  getRelationOrdering(this_00,left,local_e8,local_80);
  rel = 0;
  iVar13 = (int)((ulong)((long)this_00->_ids[lVar25].
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)this_00->_ids[lVar25].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar12 = seekValue(this_00,node_01,&rel,local_80,iVar13,&l,upper,&val);
  local_e0 = 0;
  if (!bVar12) {
    ppDVar1 = &node_01->_firstChild;
    local_e0 = 0;
    local_a8 = lVar20;
    do {
      pvVar7 = this_00->_ids;
      lVar25 = (long)(&(pvVar7->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish)[lVar20] -
               (long)(&(pvVar7->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)[lVar20];
      if (lVar25 != 0) {
        lVar25 = lVar25 >> 3;
        lVar22 = 0;
        do {
          ppVar8 = pvVar7[node_01->_id].
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar4 = ppVar8[lVar22].first;
          iVar5 = ppVar8[lVar22].second;
          lVar28 = (long)left[iVar4];
          pTVar9 = this_00->_data;
          while (upper_00[iVar4] = (int)lVar28, lVar28 < upper[iVar4]) {
            lVar11 = lVar28 + 1;
            lVar28 = lVar28 + 1;
            dVar2 = pTVar9[iVar4].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11][iVar5];
            if ((dVar2 != val) || (NAN(dVar2) || NAN(val))) break;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != lVar25 + (ulong)(lVar25 == 0));
      }
      if ((int)local_c8 < 1) {
        iVar10._M_current = *(double **)(local_d8 + 8);
        if (iVar10._M_current == *(double **)(local_d8 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_d8,iVar10,&val);
        }
        else {
          *iVar10._M_current = val;
          *(double **)(local_d8 + 8) = iVar10._M_current + 1;
        }
        local_e0 = (ulong)((int)local_e0 + 1);
      }
      else {
        local_88[local_d0] = val;
        uVar24 = 0;
        ppDVar29 = ppDVar1;
        do {
          node_00 = *ppDVar29;
          pUVar16 = leapfroggingJoin(this_00,node_00,left,upper_00,local_94);
          local_b8[uVar24] = pUVar16;
          lVar20 = local_a8;
          node_01 = local_e8;
          if (pUVar16 == (Union *)0x0) goto LAB_0011f37c;
          ppDVar29 = &node_00->_next;
          uVar24 = uVar24 + 1;
        } while (local_c8 != uVar24);
        iVar10._M_current = *(double **)(local_d8 + 8);
        if (iVar10._M_current == *(double **)(local_d8 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_d8,iVar10,&val);
        }
        else {
          *iVar10._M_current = val;
          *(double **)(local_d8 + 8) = iVar10._M_current + 1;
        }
        uVar23 = 1;
        pvVar21 = local_c0;
        uVar24 = local_c8;
        ppUVar18 = local_b8;
        do {
          __position._M_current = *(Union ***)(pvVar21 + 8);
          if (__position._M_current == *(Union ***)(pvVar21 + 0x10)) {
            std::vector<node::Union*,std::allocator<node::Union*>>::
            _M_realloc_insert<node::Union*const&>(local_c0,__position,ppUVar18);
            pvVar21 = local_c0;
          }
          else {
            *__position._M_current = *ppUVar18;
            *(long *)(pvVar21 + 8) = *(long *)(pvVar21 + 8) + 8;
          }
          uVar23 = uVar23 * (*ppUVar18)->count;
          ppUVar18 = ppUVar18 + 1;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
        local_e0 = (ulong)((int)local_e0 + uVar23);
        keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(double)uVar23;
        iVar10._M_current =
             (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_90,iVar10,(double *)&keyVals);
          lVar20 = local_a8;
          this_00 = local_b0;
          node_01 = local_e8;
        }
        else {
          *iVar10._M_current =
               (double)keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
          lVar20 = local_a8;
          this_00 = local_b0;
          node_01 = local_e8;
        }
      }
LAB_0011f37c:
      ppVar8 = (&(this_00->_ids->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start)[lVar20];
      lVar25 = (long)(&(this_00->_ids->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish)[lVar20] - (long)ppVar8;
      if (lVar25 != 0) {
        lVar25 = lVar25 >> 3;
        lVar22 = 0;
        do {
          left[ppVar8[lVar22].first] = upper_00[ppVar8[lVar22].first];
          lVar22 = lVar22 + 1;
        } while (lVar25 + (ulong)(lVar25 == 0) != lVar22);
      }
      iVar4 = ppVar8[local_80[rel]].first;
      iVar5 = left[iVar4];
      left[iVar4] = iVar5 + 1;
      if (upper[iVar4] <= iVar5) break;
      rel = (rel + 1) % iVar13;
      bVar12 = seekValue(this_00,node_01,&rel,local_80,iVar13,&l,upper,&val);
    } while (!bVar12);
  }
  lVar20 = *(long *)(local_d8 + 8);
  lVar25 = *(long *)local_d8;
  iVar13 = (int)((ulong)(lVar20 - lVar25) >> 3);
  if (iVar13 == 0) {
    pUVar16 = (Union *)0x0;
  }
  else {
    pUVar16 = (Union *)operator_new(0x38);
    pUVar16->numberOfValues = 0;
    *(undefined8 *)&pUVar16->cacheIndex = 0;
    pUVar16->values = (double *)0x0;
    pUVar16->children = (Union **)0x0;
    *(undefined8 *)&pUVar16->multiplicity = 0;
    pUVar16->sums = (double *)0x0;
    pUVar16->sumIndexes = (int *)0x0;
    uVar24 = (ulong)iVar13;
    pUVar16->numberOfValues = uVar24;
    this_00->numberOfValues = this_00->numberOfValues + uVar24;
    __n = (lVar20 - lVar25) * 0x20000000 >> 0x1d;
    if (local_c8 == 0) {
      pdVar17 = (double *)operator_new__(-(ulong)(uVar24 >> 0x3d != 0) | __n);
      pUVar16->values = pdVar17;
      pdVar26 = *(pointer *)local_d8;
    }
    else {
      uVar27 = 0xffffffffffffffff;
      if (-1 < iVar13) {
        uVar27 = (long)(iVar13 * 2) << 3;
      }
      pdVar17 = (double *)operator_new__(uVar27);
      pUVar16->values = pdVar17;
      memcpy(pdVar17,*(void **)local_d8,__n);
      pdVar17 = pdVar17 + uVar24;
      pdVar26 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      node_01 = local_e8;
    }
    memcpy(pdVar17,pdVar26,__n);
    iVar13 = (int)local_c8 * iVar13;
    uVar24 = 0xffffffffffffffff;
    if (-1 < iVar13) {
      uVar24 = (long)iVar13 * 8;
    }
    ppUVar18 = (Union **)operator_new__(uVar24);
    pdVar17 = local_88;
    pUVar16->children = ppUVar18;
    lVar20 = *(long *)local_c0;
    if (*(long *)(local_c0 + 8) != lVar20) {
      uVar24 = 0;
      do {
        ppUVar18[uVar24] = *(Union **)(lVar20 + uVar24 * 8);
        uVar24 = uVar24 + 1;
        lVar20 = *(long *)local_c0;
      } while (uVar24 < (ulong)(*(long *)(local_c0 + 8) - lVar20 >> 3));
    }
    pUVar16->count = (uint)local_e0;
    if (bVar3 != false) {
      keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(double)(int)local_d0;
      std::vector<double,_std::allocator<double>_>::vector
                (&keyVals_1,
                 ((long)(node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) + 1,(value_type_conflict3 *)&keyVals,
                 &local_e9);
      piVar6 = (node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar20 = (long)(node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar6;
      if (lVar20 != 0) {
        lVar20 = lVar20 >> 2;
        lVar25 = 0;
        do {
          keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar25] = pdVar17[piVar6[lVar25]];
          lVar25 = lVar25 + 1;
        } while (lVar20 + (ulong)(lVar20 == 0) != lVar25);
      }
      __mutex = (pthread_mutex_t *)&this_00->_cacheMutex;
      iVar13 = pthread_mutex_lock(__mutex);
      if (iVar13 != 0) {
LAB_0011f67e:
        uVar19 = std::__throw_system_error(iVar13);
        if (keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pthread_mutex_unlock(__mutex);
        if (keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar19);
      }
      uVar23 = this_00->numberOfCachedValues;
      pUVar16->cacheIndex = (unsigned_short)uVar23;
      this_00->numberOfCachedValues = uVar23 + 1;
      std::vector<double,_std::allocator<double>_>::vector(&keyVals,&keyVals_1);
      std::
      _Hashtable<std::vector<double,std::allocator<double>>,std::pair<std::vector<double,std::allocator<double>>const,node::Union*>,std::allocator<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>,std::__detail::_Select1st,std::equal_to<std::vector<double,std::allocator<double>>>,std::hash<std::vector<double,std::allocator<double>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>
                ((_Hashtable<std::vector<double,std::allocator<double>>,std::pair<std::vector<double,std::allocator<double>>const,node::Union*>,std::allocator<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>,std::__detail::_Select1st,std::equal_to<std::vector<double,std::allocator<double>>>,std::hash<std::vector<double,std::allocator<double>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this_00->_caches);
      if (keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pthread_mutex_unlock(__mutex);
      if (keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return pUVar16;
}

Assistant:

Union* FactorisedJoin::leapfroggingJoin(
    DTreeNode* node, int* lower, int* upper, unsigned int partition)
{
    int_fast16_t nodeID = node->_id;
    bool caching = node->_caching;
    double* varMap = _partitionFields[partition].varMap;
    int childrenCount = node->_numOfChildren;

    /* If this node allows for caching we check if the aggregate array has been
     * cached already. */
    if (caching)
    {
        /* 
         * We initialise the elements in the vector to nodeID instead of 
         * default-initialising them. The last element will not be overwritten. 
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        lock_guard<mutex> lock(_cacheMutex);
		
        auto it = _caches.find(keyVals);
        if (it != _caches.end())
        {
            return it->second;			// Return pointer to cached union node.
        }
    }

    /* lower range pointer for each relation. */
    int* l = _partitionFields[partition].LOWERBOUND[nodeID];
    memcpy(l, lower, sizeof(int) * NUM_OF_TABLES);

    /* upper range pointer for each relation. */
    int* u = _partitionFields[partition].UPPERBOUND[nodeID];
    memcpy(u, upper, sizeof(int) * NUM_OF_TABLES);

    vector<double>& unionValues = _partitionFields[partition].values[nodeID];
    unionValues.clear();

    vector<double>& unionCounts = _partitionFields[partition].localCount[nodeID];
    unionCounts.clear();

    vector<Union*>& unionPointers = _partitionFields[partition].pointers[nodeID];
    unionPointers.clear();

    Union** localPointers = _partitionFields[partition].localPointerPlaceholder[nodeID];

    int* ordering = _partitionFields[partition].ordering[nodeID];

    /* Provides order of Relations from min -> max. */
    getRelationOrdering(l, node, ordering);

    /* Value that satisfies the join query - set in seekValue. */
    double val;
    unsigned int count = 0; 

    /* Indexes used by the join algorithm. */
    int i, j, rel = 0, numOfRel = _ids[nodeID].size();
    bool atEnd = false;
    while (!atEnd)
    {
        /* seek the value that satisfies the join query */
        atEnd = seekValue(node, rel, ordering, numOfRel, l, upper, val);

        if (atEnd)
            break;

        /* Get range of tuples with value equal to val. */
        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[node->_id][k].first;
            j = _ids[node->_id][k].second;
            u[i] = l[i];

            // TODO: This could be optimized and perhaps added to seek value
            while (u[i] < upper[i] && _data[i][u[i] + 1][j] == val)
            {
                ++u[i];
            }
        }

        /*
         * Below the aggregates are updated based on the value that
         * satisfied the join query.
         */
        if (childrenCount > 0)
        {
            bool childEmpty = false;

            /* 
             * Update the varMap which keeps track of the values that satisfy the 
             * join query above this node 
             */
            varMap[nodeID] = val;

            DTreeNode* child = node->_firstChild;
            for (int i = 0; i < childrenCount; ++i)
            {
                /* Call join algorithm for each child */
                localPointers[i] = leapfroggingJoin(child, l, u, partition);

                /*
                 * If the first aggregate for child is zero then count = 0
                 * and the join query is not satisfied for this value. 
                 */ 
                if (localPointers[i] == nullptr)
                {
                    childEmpty = true;
                    break;
                }

                child = child->_next;
            }

            /* if no child is empty we update the aggregates */
            if (!childEmpty)
            {
                /* Push back the value from this node */ 
                unionValues.push_back(val);

                unsigned int localCount = 1;
                for (int i = 0; i < childrenCount; ++i)
                {
                    unionPointers.push_back(localPointers[i]);
                    localCount *= localPointers[i] -> count; 
                }

                count += localCount;
                unionCounts.push_back(localCount);
            }
        }
        /* Case for leaf nodes */
        else
        {
            /* Push back the value from this node */ 
            unionValues.push_back(val);
            ++count;
        }

        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[nodeID][k].first;
            l[i] = u[i];
        }

        i = _ids[nodeID][ordering[rel]].first;
        l[i] += 1;

        if (l[i] > upper[i])
        {
            atEnd = true;
            break;
        }
        else
        {
            rel = (rel + 1) % numOfRel;
        }
    }

    int numOfUnionValues = unionValues.size(); 
    /*
     * If unionValues.size() == 0 it means that no value for this node
     * has satisfied the join query, so the union is empty.
     */
    if (numOfUnionValues == 0) 
    {
        // delete unionNode; 
        return nullptr;
    }

    /* If there are values in the union we construct the union */
    Union* unionNode = new Union();
    unionNode->numberOfValues = numOfUnionValues;

    numberOfValues += numOfUnionValues; 

    if (childrenCount == 0)
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));
    }
    else
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues * 2];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));

        /* Copy values into array */
        memcpy(unionNode->values+numOfUnionValues, &unionCounts[0],
               numOfUnionValues*sizeof(double));
    }

    assert( (size_t) numOfUnionValues * childrenCount == unionPointers.size());

    /* Initialise pointer array */
    unionNode->children = new Union*[numOfUnionValues * childrenCount];

    /* Copy pointer into array */
    for (size_t pointer = 0; pointer < unionPointers.size(); ++pointer)
        unionNode->children[pointer] = unionPointers[pointer];

    unionNode -> count = count; 
	
    /* If we get here and caching is allowed it means that we need to add
     * aggregates to cache. */
    if (caching)
    {
        /*
         * We initialise the elements in the vector to nodeID instead of
         * default-initialising them.  The last element will not be overwritten.
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        /* Lock the _caches map so we can savely insert our newly cached values */
        lock_guard<mutex> lock(_cacheMutex);
        unionNode->cacheIndex = numberOfCachedValues;
        ++numberOfCachedValues;
        _caches.insert({ keyVals, unionNode });
    }

    return unionNode; 
}